

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_brent.c
# Opt level: O2

double xc_math_brent(xc_brent_f *f,double lower_bound,double upper_bound,double TOL,double MAX_ITER,
                    void *f_params)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined8 in_XMM0_Qb;
  undefined1 auVar9 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 local_a8 [16];
  undefined1 local_88 [16];
  
  local_a8._8_8_ = in_XMM1_Qb;
  local_a8._0_8_ = upper_bound;
  local_88._8_8_ = in_XMM0_Qb;
  local_88._0_8_ = lower_bound;
  dVar5 = (*f)(lower_bound,f_params);
  dVar6 = (*f)(upper_bound,f_params);
  if (0.0 < dVar5 * dVar6) {
    fprintf(_stderr,"Brent: bracketing error [%lf,%lf]\n");
    exit(1);
  }
  if (ABS(dVar6) <= ABS(dVar5)) {
    auVar13._8_8_ = dVar5;
    auVar13._0_8_ = lower_bound;
    local_88 = local_a8;
    dVar7 = dVar6;
    upper_bound = lower_bound;
  }
  else {
    auVar13._8_8_ = dVar6;
    auVar13._0_8_ = upper_bound;
    dVar7 = dVar5;
    dVar5 = dVar6;
  }
  bVar1 = true;
  iVar3 = 1;
  dVar6 = 0.0;
  while( true ) {
    dVar8 = dVar7;
    dVar7 = auVar13._0_8_;
    dVar11 = local_88._0_8_;
    if (MAX_ITER <= (double)iVar3) break;
    if (ABS(dVar11 - dVar7) < TOL) goto LAB_00e68f2d;
    dVar15 = auVar13._8_8_;
    if ((dVar15 != dVar5) || (NAN(dVar15) || NAN(dVar5))) {
      if ((dVar8 == dVar5) && (!NAN(dVar8) && !NAN(dVar5))) goto LAB_00e68d3f;
      auVar16._0_8_ = (dVar15 - dVar5) * (dVar15 - dVar8);
      auVar16._8_8_ = (dVar5 - dVar8) * (dVar5 - dVar15);
      auVar14._0_8_ = dVar8 * dVar7 * dVar5;
      auVar14._8_8_ = upper_bound * dVar15 * dVar8;
      auVar16 = divpd(auVar14,auVar16);
      dVar5 = auVar16._8_8_ +
              (dVar11 * dVar15 * dVar5) / ((dVar8 - dVar5) * (dVar8 - dVar15)) + auVar16._0_8_;
    }
    else {
LAB_00e68d3f:
      dVar5 = dVar11 - ((dVar11 - dVar7) * dVar8) / (dVar8 - dVar15);
    }
    if ((dVar5 < (dVar7 * 3.0 + dVar11) * 0.25) || (dVar11 < dVar5)) {
LAB_00e68e03:
      dVar5 = (dVar7 + dVar11) * 0.5;
      bVar1 = true;
    }
    else {
      if (!bVar1) {
        dVar6 = ABS(upper_bound - dVar6);
        if (ABS(dVar5 - dVar11) < dVar6 * 0.5) goto joined_r0x00e68dce;
        goto LAB_00e68e03;
      }
      dVar6 = ABS(dVar11 - upper_bound);
      if (dVar6 * 0.5 <= ABS(dVar5 - dVar11)) goto LAB_00e68e03;
joined_r0x00e68dce:
      if (dVar6 < TOL) goto LAB_00e68e03;
      bVar1 = false;
    }
    dVar6 = (*f)(dVar5,f_params);
    uVar2 = (uint)(dVar15 * dVar6 < 0.0);
    auVar12._0_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
    auVar12._4_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
    auVar12._8_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
    auVar12._12_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
    auVar10._8_8_ = dVar6;
    auVar10._0_8_ = dVar5;
    auVar14 = auVar13 & auVar12 | ~auVar12 & auVar10;
    auVar9._8_8_ = dVar8;
    auVar9._0_8_ = dVar11;
    auVar16 = ~auVar12 & auVar9 | auVar10 & auVar12;
    dVar5 = ABS(auVar14._8_8_);
    dVar6 = ABS(auVar16._8_8_);
    auVar13 = auVar16;
    local_88 = auVar14;
    if (dVar6 <= dVar5) {
      auVar13 = auVar14;
      local_88 = auVar16;
    }
    uVar4 = -(ulong)(dVar5 < dVar6);
    iVar3 = iVar3 + 1;
    dVar7 = (double)(~uVar4 & (ulong)auVar16._8_8_ | (ulong)auVar14._8_8_ & uVar4);
    dVar5 = dVar8;
    dVar6 = upper_bound;
    upper_bound = dVar11;
  }
  fwrite("Warning: Convergence not reached in brent\n",0x2a,1,_stderr);
LAB_00e68f2d:
  return (dVar7 + dVar11) * 0.5;
}

Assistant:

GPU_FUNCTION
double xc_math_brent
(xc_brent_f f,
 double lower_bound, double upper_bound,
 double TOL, double MAX_ITER,
 void *f_params)
{
  double a, b, fa, fb, fs;
  double tmp;
  double c, fc, s, d;
  int mflag, iter;

  a = lower_bound;
  b = upper_bound;
  fa = f(a, f_params);
  fb = f(b, f_params);
  fs = 0;

  if (fa * fb > 0){
#ifndef HAVE_CUDA
    fprintf(stderr, "Brent: bracketing error [%lf,%lf]\n", a, b);
    exit(1);
#endif
  }

  if (fabs(fa) < fabs(fb)){
    tmp = a;   a =  b;  b = tmp; /* swap  a and  b */
    tmp = fa; fa = fb; fb = tmp; /* swap fa and fb */
  }

  c = a;     /* c now equals the largest magnitude of the lower and upper bounds */
  fc = fa;   /* precompute function evalutation for point c by assigning it the same value as fa */
  mflag = 1; /* boolean flag used to evaluate if statement later on */
  s = 0;     /* Our root that will be returned */
  d = 0;     /* Only used if mflag is unset (mflag == false) */

  for (iter=1; iter<MAX_ITER; ++iter){
    /* stop if converged or error is less than tolerance */
    if (fabs(b - a) < TOL)
      return (b + a)/2.0;

    if (fa != fc && fb != fc){
      /* use inverse quadratic interopolation */
      s = ( a * fb * fc / ((fa - fb) * (fa - fc)) )
        + ( b * fa * fc / ((fb - fa) * (fb - fc)) )
        + ( c * fa * fb / ((fc - fa) * (fc - fb)) );
    }else{
      /* secant method */
      s = b - fb * (b - a) / (fb - fa);
    }

    /*
      (condition 1) s is not between  (3a+b)/4  and b or
      (condition 2) (mflag is true and |s−b| ≥ |b−c|/2) or
      (condition 3) (mflag is false and |s−b| ≥ |c−d|/2) or
      (condition 4) (mflag is set and |b−c| < |TOL|) or
      (condition 5) (mflag is false and |c−d| < |TOL|)
        */
    if(((s < (3 * a + b) * 0.25) || (s > b) ) ||
       (  mflag && (fabs(s-b) >= (fabs(b-c) * 0.5))) ||
       ( !mflag && (fabs(s-b) >= (fabs(c-d) * 0.5))) ||
       (  mflag && (fabs(b-c) < TOL)) ||
       ( !mflag && (fabs(c-d) < TOL))){
      /* bisection */
      s = (a+b)*0.5;
      mflag = 1;
    }else
      mflag = 0;

    fs = f(s, f_params);
    d = c;
    c = b;
    fc = fb;

    if (fa*fs < 0){
      b = s;
      fb = fs;
    }else{
      a = s;
      fa = fs;
    }

    if (fabs(fa) < fabs(fb)){
      tmp = a;   a =  b;  b = tmp; /* swap  a and  b */
      tmp = fa; fa = fb; fb = tmp; /* swap fa and fb */
    }

  }

#ifndef HAVE_CUDA
  fprintf(stderr, "Warning: Convergence not reached in brent\n");
#endif

  return (b + a)/2.0;

}